

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

char * __thiscall
arangodb::velocypack::arena<64ul,8ul>::allocate<8ul>(arena<64UL,_8UL> *this,size_t n)

{
  size_t sVar1;
  size_t in_RSI;
  long in_RDI;
  char *r;
  size_t aligned_n;
  undefined8 local_8;
  
  sVar1 = arena<64UL,_8UL>::align_up(in_RSI);
  if ((ulong)((in_RDI + 0x40) - *(long *)(in_RDI + 0x40)) < sVar1) {
    local_8 = (char *)operator_new(in_RSI);
  }
  else {
    local_8 = *(char **)(in_RDI + 0x40);
    *(size_t *)(in_RDI + 0x40) = sVar1 + *(long *)(in_RDI + 0x40);
  }
  return local_8;
}

Assistant:

char* arena<N, alignment>::allocate(std::size_t n) {
  static_assert(ReqAlign <= alignment, "alignment is too small for this arena");
  assert(pointer_in_buffer(ptr_) && "short_alloc has outlived arena");
  auto const aligned_n = align_up(n);
  if (static_cast<decltype(aligned_n)>(buf_ + N - ptr_) >= aligned_n) {
    char* r = ptr_;
    ptr_ += aligned_n;
    return r;
  }

  static_assert(alignment <= alignof(std::max_align_t),
                "you've chosen an "
                "alignment that is larger than alignof(std::max_align_t), and "
                "cannot be guaranteed by normal operator new");
  return static_cast<char*>(::operator new(n));
}